

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondEpsGen.h
# Opt level: O1

bool __thiscall
covenant::CondEpsGen<covenant::Sym>::addTrans(CondEpsGen<covenant::Sym> *this,int qi,int c,int qj)

{
  pointer *ppaVar1;
  iterator __position;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  emplace_return eVar4;
  int local_3c;
  anon_struct_12_3_f74832de local_38;
  
  local_38.end = qj;
  local_38.start = qi;
  __position._M_current =
       (this->decisions).
       super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3c = c;
  local_38.s = c;
  if (__position._M_current ==
      (this->decisions).
      super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
    ::_M_realloc_insert<covenant::CondEpsGen<covenant::Sym>::prod_info>
              (&this->decisions,__position,&local_38);
  }
  else {
    (__position._M_current)->s = c;
    (__position._M_current)->start = qi;
    (__position._M_current)->end = qj;
    ppaVar1 = &(this->decisions).
               super__Vector_base<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  eVar4 = boost::unordered::detail::
          table<boost::unordered::detail::map<std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,int,std::set<int,std::less<int>,std::allocator<int>>,boost::hash<int>,std::equal_to<int>>>
          ::try_emplace_unique<int_const&>
                    ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,int,std::set<int,std::less<int>,std::allocator<int>>,boost::hash<int>,std::equal_to<int>>>
                      *)&this->digest->term_prods,&local_3c);
  for (p_Var3 = *(_Rb_tree_node_base **)
                 ((long)&((eVar4.first.node_.node_)->value_base_).data_.data_ + 0x20);
      p_Var3 != (_Rb_tree_node_base *)
                ((long)&((eVar4.first.node_.node_)->value_base_).data_.data_ + 0x10);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    addProd(this,qi,p_Var3[1]._M_color,qj);
  }
  bVar2 = update_prods(this);
  return bVar2;
}

Assistant:

bool addTrans(int qi, int c, int qj)
    {
      // Update the automaton with a new transition.
      // Not presently checking if p[qi -> qj] alreacy
      // exists.
      decisions.push_back(mk_prod(qi, c, qj));
      
      set<int>& sing(digest.term_prods[c]);
      
      set<int>::iterator it;
      for(it = sing.begin(); it != sing.end(); ++it)
      {
        addProd(qi, *it, qj);
      }
      return update_prods();
    }